

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_59::InMemoryFile::write(InMemoryFile *this,int __fd,void *__buf,size_t __n)

{
  uchar *puVar1;
  ssize_t in_RAX;
  long lVar2;
  ssize_t extraout_RAX;
  uint64_t uVar3;
  undefined4 in_register_00000034;
  ulong uVar4;
  Fault f;
  uint64_t offset_local;
  uint64_t end;
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  
  uVar4 = CONCAT44(in_register_00000034,__fd);
  if (__n != 0) {
    _kjCondition.left = (unsigned_long *)((ulong)_kjCondition.left & 0xffffffffffffff00);
    offset_local = uVar4;
    kj::_::Mutex::lock(&(this->impl).mutex,0,&_kjCondition);
    lVar2 = (*(code *)**(undefined8 **)(this->impl).value.clock)();
    (this->impl).value.lastModified.value.value = lVar2;
    end = __n + uVar4;
    _kjCondition.left = &end;
    _kjCondition.right = &offset_local;
    _kjCondition.op.content.ptr = " >= ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = end >= uVar4;
    if (end < uVar4) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[33]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x34a,FAILED,"end >= offset","_kjCondition,\"write() request overflows uint64\"",
                 &_kjCondition,(char (*) [33])"write() request overflows uint64");
      kj::_::Debug::Fault::fatal(&f);
    }
    Impl::ensureCapacity(&(this->impl).value,end);
    uVar4 = (this->impl).value.size;
    uVar3 = end;
    if (end < uVar4) {
      uVar3 = uVar4;
    }
    puVar1 = (this->impl).value.bytes.ptr;
    (this->impl).value.size = uVar3;
    memcpy(puVar1 + offset_local,__buf,__n);
    kj::_::Mutex::unlock(&(this->impl).mutex,EXCLUSIVE,(Waiter *)0x0);
    in_RAX = extraout_RAX;
  }
  return in_RAX;
}

Assistant:

void write(uint64_t offset, ArrayPtr<const byte> data) const override {
    if (data.size() == 0) return;
    auto lock = impl.lockExclusive();
    lock->modified();
    uint64_t end = offset + data.size();
    KJ_REQUIRE(end >= offset, "write() request overflows uint64");
    lock->ensureCapacity(end);
    lock->size = kj::max(lock->size, end);
    memcpy(lock->bytes.begin() + offset, data.begin(), data.size());
  }